

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sort.h
# Opt level: O0

void Minisat::sort<unsigned_int,reduceDB_tch>(uint *array,int size,reduceDB_tch lt)

{
  undefined4 uVar1;
  bool bVar2;
  uint *in_RDX;
  int in_ESI;
  reduceDB_tch in_RDI;
  reduceDB_tch unaff_retaddr;
  int j;
  int i;
  uint tmp;
  uint pivot;
  undefined8 in_stack_ffffffffffffffb0;
  uint *in_stack_ffffffffffffffb8;
  reduceDB_tch in_stack_ffffffffffffffc0;
  int local_38;
  int local_34;
  undefined8 in_stack_ffffffffffffffe0;
  int size_00;
  undefined4 in_stack_ffffffffffffffe8;
  
  if (in_ESI < 0x10) {
    selectionSort<unsigned_int,reduceDB_tch>
              (in_stack_ffffffffffffffb8,(int)((ulong)in_stack_ffffffffffffffb0 >> 0x20),
               in_stack_ffffffffffffffc0);
  }
  else if (in_ESI < 0x21) {
    local_34 = -1;
    local_38 = in_ESI;
    while( true ) {
      do {
        local_34 = local_34 + 1;
        bVar2 = reduceDB_tch::operator()
                          ((reduceDB_tch *)in_stack_ffffffffffffffc0.ca,
                           (CRef)((ulong)in_stack_ffffffffffffffb8 >> 0x20),
                           (CRef)in_stack_ffffffffffffffb8);
      } while (bVar2);
      do {
        local_38 = local_38 + -1;
        bVar2 = reduceDB_tch::operator()
                          ((reduceDB_tch *)in_stack_ffffffffffffffc0.ca,
                           (CRef)((ulong)in_stack_ffffffffffffffb8 >> 0x20),
                           (CRef)in_stack_ffffffffffffffb8);
        size_00 = (int)((ulong)in_stack_ffffffffffffffe0 >> 0x20);
      } while (bVar2);
      if (local_38 <= local_34) break;
      uVar1 = *(undefined4 *)
               ((long)&((in_RDI.ca)->super_RegionAllocator<unsigned_int>).memory +
               (long)local_34 * 4);
      *(undefined4 *)
       ((long)&((in_RDI.ca)->super_RegionAllocator<unsigned_int>).memory + (long)local_34 * 4) =
           *(undefined4 *)
            ((long)&((in_RDI.ca)->super_RegionAllocator<unsigned_int>).memory + (long)local_38 * 4);
      *(undefined4 *)
       ((long)&((in_RDI.ca)->super_RegionAllocator<unsigned_int>).memory + (long)local_38 * 4) =
           uVar1;
    }
    sort<unsigned_int,reduceDB_tch>
              ((uint *)CONCAT44(in_ESI,in_stack_ffffffffffffffe8),size_00,in_RDI);
    sort<unsigned_int,reduceDB_tch>
              ((uint *)CONCAT44(in_ESI,in_stack_ffffffffffffffe8),size_00,in_RDI);
  }
  else {
    mergesort<unsigned_int,reduceDB_tch>(in_RDX,(int32_t)((ulong)in_RDI.ca >> 0x20),unaff_retaddr);
  }
  return;
}

Assistant:

void sort(T *array, int size, LessThan lt)
{
    if (size <= 15) {
        selectionSort(array, size, lt);
    } else if (size > 32) {
        mergesort(array, size, lt);
    } else {
        T pivot = array[size / 2];
        T tmp;
        int i = -1;
        int j = size;

        for (;;) {
            do
                i++;
            while (lt(array[i], pivot));
            do
                j--;
            while (lt(pivot, array[j]));

            if (i >= j) break;

            tmp = array[i];
            array[i] = array[j];
            array[j] = tmp;
        }

        sort(array, i, lt);
        sort(&array[i], size - i, lt);
    }
}